

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v11::vprint(FILE *f,string_view fmt,format_args args)

{
  file_print_buffer<_IO_FILE,_void> local_50;
  
  if ((f->_flags & 2) == 0) {
    detail::file_print_buffer<_IO_FILE,_void>::file_print_buffer(&local_50,f);
    detail::vformat_to(&local_50.super_buffer<char>,fmt,args,(locale_ref)0x0);
    detail::file_print_buffer<_IO_FILE,_void>::~file_print_buffer(&local_50);
    return;
  }
  vprint_buffered(f,fmt,args);
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view fmt, format_args args) {
  if (!detail::file_ref(f).is_buffered() || !detail::has_flockfile<>())
    return vprint_buffered(f, fmt, args);
  auto&& buffer = detail::file_print_buffer<>(f);
  return detail::vformat_to(buffer, fmt, args);
}